

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O3

void __thiscall SQLiteTestFixture::setup(SQLiteTestFixture *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_d8;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  char *local_a0;
  const_string local_88 [2];
  const_string local_68 [2];
  const_string local_48 [2];
  const_string local_28;
  
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));","")
  ;
  cpp_db::statement::statement
            ((statement *)local_b8,&local_d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_b8);
  cpp_db::statement::~statement((statement *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1b;
  local_d8._M_dataplus._M_p._0_1_ = 1;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_001962c8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "no exceptions thrown by cpp_db::statement(\"create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));\", *con).execute_non_query()"
  ;
  local_28.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_28.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_b8,&local_28,0x1b,CHECK,CHECK_MSG,0
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"insert into TEST_TABLE(COL1, COL2) VALUES(1, \'first\')","");
  cpp_db::statement::statement
            ((statement *)local_b8,&local_d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_b8);
  cpp_db::statement::~statement((statement *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1c;
  local_d8._M_dataplus._M_p._0_1_ = 1;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_00196348;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(1, \'first\')\", *con).execute_non_query()"
  ;
  local_48[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_48[0].m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_b8,local_48,0x1c,CHECK,CHECK_MSG,0)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"insert into TEST_TABLE(COL1, COL2) VALUES(2, \'second\')","");
  cpp_db::statement::statement
            ((statement *)local_b8,&local_d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_b8);
  cpp_db::statement::~statement((statement *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  local_d8._M_dataplus._M_p._0_1_ = 1;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_001963c8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(2, \'second\')\", *con).execute_non_query()"
  ;
  local_68[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_68[0].m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_b8,local_68,0x1d,CHECK,CHECK_MSG,0)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"insert into TEST_TABLE(COL1, COL2) VALUES(3, \'third\')","");
  cpp_db::statement::statement
            ((statement *)local_b8,&local_d8,
             (this->con).super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute_non_query((statement *)local_b8);
  cpp_db::statement::~statement((statement *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1e;
  local_d8._M_dataplus._M_p._0_1_ = 1;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_b8[8] = false;
  local_b8._0_8_ = &PTR__lazy_ostream_00196348;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "no exceptions thrown by cpp_db::statement(\"insert into TEST_TABLE(COL1, COL2) VALUES(3, \'third\')\", *con).execute_non_query()"
  ;
  local_88[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_88[0].m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_b8,local_88,0x1e,CHECK,CHECK_MSG,0)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  return;
}

Assistant:

void setup()
    {
        BOOST_CHECK_NO_THROW(cpp_db::statement("create table TEST_TABLE(COL1 INT NOT NULL, COL2 VARCHAR(50));", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(1, 'first')", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(2, 'second')", *con).execute_non_query());
        BOOST_CHECK_NO_THROW(cpp_db::statement("insert into TEST_TABLE(COL1, COL2) VALUES(3, 'third')", *con).execute_non_query());
    }